

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

counting_iterator
duckdb_fmt::v6::internal::write_exponent<char,_duckdb_fmt::v6::internal::counting_iterator>
          (int exp,counting_iterator it)

{
  size_t in_RSI;
  int in_EDI;
  char *d;
  char *top;
  counting_iterator *in_stack_ffffffffffffff68;
  counting_iterator cStack_90;
  value_type vStack_83;
  char acStack_82 [2];
  counting_iterator cStack_80;
  value_type vStack_72;
  char cStack_71;
  char *pcStack_70;
  counting_iterator cStack_60;
  value_type vStack_53;
  char acStack_52 [2];
  counting_iterator cStack_50;
  value_type vStack_42;
  char cStack_41;
  char *pcStack_40;
  counting_iterator cStack_30;
  value_type vStack_23;
  char acStack_22 [2];
  counting_iterator cStack_20;
  value_type vStack_16;
  char cStack_15;
  int iStack_14;
  size_t sStack_10;
  
  iStack_14 = in_EDI;
  sStack_10 = in_RSI;
  if (in_EDI < 0) {
    cStack_15 = '-';
    cStack_20 = counting_iterator::operator++(in_stack_ffffffffffffff68,0);
    counting_iterator::operator*(&cStack_20);
    counting_iterator::value_type::operator=<char>(&vStack_16,&cStack_15);
    iStack_14 = -iStack_14;
  }
  else {
    acStack_22[0] = '+';
    cStack_30 = counting_iterator::operator++(in_stack_ffffffffffffff68,0);
    counting_iterator::operator*(&cStack_30);
    counting_iterator::value_type::operator=<char>(&vStack_23,acStack_22);
  }
  if (99 < iStack_14) {
    pcStack_40 = basic_data<void>::digits + (iStack_14 / 100 << 1);
    if (999 < iStack_14) {
      cStack_41 = *pcStack_40;
      cStack_50 = counting_iterator::operator++(in_stack_ffffffffffffff68,0);
      counting_iterator::operator*(&cStack_50);
      counting_iterator::value_type::operator=<char>(&vStack_42,&cStack_41);
    }
    acStack_52[0] = pcStack_40[1];
    cStack_60 = counting_iterator::operator++(in_stack_ffffffffffffff68,0);
    counting_iterator::operator*(&cStack_60);
    counting_iterator::value_type::operator=<char>(&vStack_53,acStack_52);
    iStack_14 = iStack_14 % 100;
  }
  pcStack_70 = basic_data<void>::digits + (iStack_14 << 1);
  cStack_71 = *pcStack_70;
  cStack_80 = counting_iterator::operator++(in_stack_ffffffffffffff68,0);
  counting_iterator::operator*(&cStack_80);
  counting_iterator::value_type::operator=<char>(&vStack_72,&cStack_71);
  acStack_82[0] = pcStack_70[1];
  cStack_90 = counting_iterator::operator++(in_stack_ffffffffffffff68,0);
  counting_iterator::operator*(&cStack_90);
  counting_iterator::value_type::operator=<char>(&vStack_83,acStack_82);
  return (counting_iterator)sStack_10;
}

Assistant:

It write_exponent(int exp, It it) {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits + (exp / 100) * 2;
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits + exp * 2;
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}